

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O0

exr_result_t
internal_exr_undo_b44
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  void **in_RCX;
  undefined8 in_RDX;
  exr_transcoding_pipeline_buffer_id_t bufid;
  exr_decode_pipeline_t *in_RSI;
  exr_decode_pipeline_t *in_RDI;
  size_t *in_R8;
  exr_result_t rv;
  uint64_t in_stack_00000068;
  void *in_stack_00000070;
  uint64_t in_stack_00000078;
  void *in_stack_00000080;
  exr_decode_pipeline_t *in_stack_00000088;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  bufid = (exr_transcoding_pipeline_buffer_id_t)((ulong)in_RDX >> 0x20);
  compute_scratch_buffer_size(in_RDI,(uint64_t)in_R8);
  local_4 = internal_decode_alloc_buffer
                      (in_RSI,bufid,in_RCX,in_R8,
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (local_4 == 0) {
    local_4 = uncompress_b44_impl(in_stack_00000088,in_stack_00000080,in_stack_00000078,
                                  in_stack_00000070,in_stack_00000068);
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_undo_b44 (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t rv;
    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        compute_scratch_buffer_size (decode, uncompressed_size));
    if (rv != EXR_ERR_SUCCESS) return rv;

    return uncompress_b44_impl (
        decode,
        compressed_data,
        comp_buf_size,
        uncompressed_data,
        uncompressed_size);
}